

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Projection.cpp
# Opt level: O3

void __thiscall
Projection::initialSyncProject
          (Projection *this,int c_lev,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *sig,Real dt,Real strt_time,
          int have_divu)

{
  pointer ppAVar1;
  unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> uVar2;
  FabArrayBase *fabarray_;
  AmrLevel *pAVar3;
  _func_int *p_Var4;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *pVVar5;
  pointer puVar6;
  bool bVar7;
  TimeCenter TVar8;
  undefined4 uVar9;
  long lVar10;
  _func_int **pp_Var11;
  pointer ppMVar12;
  pointer *ppbVar13;
  MultiFab *this_00;
  NavierStokesBase *pNVar14;
  FabArray<amrex::FArrayBox> *pFVar15;
  FabArray<amrex::FArrayBox> *pFVar16;
  long lVar17;
  undefined4 in_register_0000000c;
  BoxArray *grids;
  MultiFab *pMVar18;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 uVar19;
  undefined8 extraout_RDX_05;
  long lVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  int iVar25;
  long lVar26;
  double dVar27;
  int Divu_Type;
  Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  rhcc;
  int Divu;
  MFIter mfi;
  MultiFab v_fine;
  int local_4d8;
  int local_4d4;
  double local_4d0;
  _func_int **local_4c8;
  long local_4c0;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *local_4b8;
  int local_4ac;
  vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  local_4a8;
  Real local_490;
  Real local_488;
  long local_480;
  FabArray<amrex::FArrayBox> *local_478;
  FabArray<amrex::FArrayBox> *local_470;
  undefined1 local_468 [80];
  element_type *local_418;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_410;
  element_type *local_408;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_400;
  Box local_3f8;
  int local_3dc;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> local_3d8;
  undefined1 local_3c0 [24];
  pointer local_3a8;
  undefined8 uStack_3a0;
  int local_398;
  undefined1 local_380 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  avStack_370 [7];
  int local_2b4;
  Array4<double> local_1f8;
  undefined1 local_1b8 [24];
  pointer local_1a0;
  undefined8 uStack_198;
  int local_190;
  
  grids = (BoxArray *)CONCAT44(in_register_0000000c,have_divu);
  iVar25 = *(int *)&(this->parent->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
  lVar10 = (long)iVar25;
  local_4d4 = have_divu;
  local_490 = dt;
  local_488 = strt_time;
  if (verbose != 0) {
    local_380._8_8_ = amrex::OutStream();
    local_380._4_4_ = *(undefined4 *)(DAT_00816950 + -0x48);
    local_380._0_4_ = *(undefined4 *)(DAT_00816950 + -0x30);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)avStack_370);
    grids = *(BoxArray **)
             ((long)avStack_370[0].
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start - 0x18);
    *(undefined8 *)
     ((long)&avStack_370[0].
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + (long)grids) =
         *(undefined8 *)
          ((ostream *)(local_380._8_8_ + 8) + *(long *)(*(long *)local_380._8_8_ + -0x18));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)avStack_370,"Projection::initialSyncProject(): levels = ",0x2b);
    std::ostream::operator<<((ostringstream *)avStack_370,c_lev);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)avStack_370," - ",3);
    std::ostream::operator<<((ostringstream *)avStack_370,iVar25);
    local_1b8[0] = 10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)avStack_370,local_1b8,1);
    amrex::Print::~Print((Print *)local_380);
    if ((verbose != 0) && ((anonymous_namespace)::benchmarking == '\x01')) {
      amrex::ParallelDescriptor::Barrier((string *)amrex::ParallelDescriptor::Unnamed_abi_cxx11_);
    }
  }
  local_468._24_8_ = amrex::ParallelDescriptor::second();
  pp_Var11 = (_func_int **)operator_new(0x50);
  local_468._8_8_ = pp_Var11 + 10;
  pp_Var11[8] = (_func_int *)0x0;
  pp_Var11[9] = (_func_int *)0x0;
  pp_Var11[6] = (_func_int *)0x0;
  pp_Var11[7] = (_func_int *)0x0;
  pp_Var11[4] = (_func_int *)0x0;
  pp_Var11[5] = (_func_int *)0x0;
  pp_Var11[2] = (_func_int *)0x0;
  pp_Var11[3] = (_func_int *)0x0;
  *pp_Var11 = (_func_int *)0x0;
  pp_Var11[1] = (_func_int *)0x0;
  local_468._0_8_ = pp_Var11;
  local_468._16_8_ = local_468._8_8_;
  ppMVar12 = (pointer)operator_new(0x50);
  local_3d8.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
  super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
  super__Vector_impl_data._M_finish = ppMVar12 + 10;
  ppMVar12[8] = (MultiFab *)0x0;
  ppMVar12[9] = (MultiFab *)0x0;
  ppMVar12[6] = (MultiFab *)0x0;
  ppMVar12[7] = (MultiFab *)0x0;
  ppMVar12[4] = (MultiFab *)0x0;
  ppMVar12[5] = (MultiFab *)0x0;
  ppMVar12[2] = (MultiFab *)0x0;
  ppMVar12[3] = (MultiFab *)0x0;
  *ppMVar12 = (MultiFab *)0x0;
  ppMVar12[1] = (MultiFab *)0x0;
  local_3d8.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
  super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
  super__Vector_impl_data._M_start = ppMVar12;
  local_3d8.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
  super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_3d8.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
       super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (c_lev <= iVar25) {
    lVar20 = (long)c_lev;
    iVar21 = (iVar25 - c_lev) + 1;
    do {
      ppAVar1 = (this->LevelData).
                super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      pp_Var11[lVar20] =
           *(_func_int **)
            (*(long *)&(ppAVar1[lVar20]->state).
                       super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                       super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_> + 200
            );
      pFVar16 = *(FabArray<amrex::FArrayBox> **)
                 (*(long *)&(ppAVar1[lVar20]->state).
                            super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                            super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>
                 + 0x1b0);
      ppMVar12[lVar20] = (MultiFab *)pFVar16;
      grids = (BoxArray *)&(pFVar16->super_FabArrayBase).n_grow;
      amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                (pFVar16,0.0,0,(pFVar16->super_FabArrayBase).n_comp,(IntVect *)grids);
      lVar20 = lVar20 + 1;
      iVar21 = iVar21 + -1;
    } while (iVar21 != 0);
  }
  local_4a8.
  super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4a8.
  super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4a8.
  super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4c8 = pp_Var11;
  local_4b8 = sig;
  if (local_4d4 != 0) {
    std::
    vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
    ::resize(&local_4a8,10);
    if (iVar25 < c_lev) goto LAB_0036b4d9;
    local_468._40_8_ = 1.0 / local_490;
    local_468._32_8_ = local_490 + local_488;
    lVar20 = (long)c_lev;
    local_4ac = iVar25 + 1;
    do {
      uVar2._M_t.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
      super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
      super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
           (this->parent->amr_level).
           super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
           .
           super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[lVar20]._M_t;
      local_380._0_8_ = avStack_370;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_380,"divu","");
      bVar7 = amrex::AmrLevel::isStateVariable((string *)local_380,&local_4d8,&local_3dc);
      if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_380._0_8_ != avStack_370) {
        operator_delete((void *)local_380._0_8_,
                        (ulong)((long)avStack_370[0].
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 1));
      }
      local_480 = lVar20;
      if (!bVar7) {
        amrex::Error_host("Projection::initialSyncProject(): Divu not found");
      }
      pFVar16 = *(FabArray<amrex::FArrayBox> **)
                 (*(long *)((long)uVar2._M_t.
                                  super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                  .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl +
                           0x170) + 200 + (long)local_4d8 * 0xe0);
      pFVar15 = *(FabArray<amrex::FArrayBox> **)
                 (*(long *)((long)uVar2._M_t.
                                  super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                  .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl +
                           0x170) + 0xd0 + (long)local_4d8 * 0xe0);
      amrex::FabArray<amrex::FArrayBox>::FillBoundary<double>(pFVar16,false);
      amrex::FabArray<amrex::FArrayBox>::FillBoundary<double>(pFVar15,false);
      lVar20 = *(long *)((long)uVar2._M_t.
                               super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                               .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x170
                        ) + (long)local_4d8 * 0xe0;
      TVar8 = amrex::StateDescriptor::timeType
                        (*(StateDescriptor **)
                          (*(long *)((long)uVar2._M_t.
                                           super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                           .super__Head_base<0UL,_amrex::AmrLevel_*,_false>.
                                           _M_head_impl + 0x170) + 8 + (long)local_4d8 * 0xe0));
      if (TVar8 == Point) {
        dVar27 = *(double *)(lVar20 + 0xc0);
      }
      else {
        dVar27 = (*(double *)(lVar20 + 0xb8) + *(double *)(lVar20 + 0xc0)) * 0.5;
      }
      lVar20 = *(long *)((long)uVar2._M_t.
                               super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                               .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x170
                        ) + (long)local_4d8 * 0xe0;
      TVar8 = amrex::StateDescriptor::timeType
                        (*(StateDescriptor **)
                          (*(long *)((long)uVar2._M_t.
                                           super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                           .super__Head_base<0UL,_amrex::AmrLevel_*,_false>.
                                           _M_head_impl + 0x170) + 8 + (long)local_4d8 * 0xe0));
      if (TVar8 == Point) {
        local_4d0 = *(double *)(lVar20 + 0xb0);
      }
      else {
        local_4d0 = (*(double *)(lVar20 + 0xa8) + *(double *)(lVar20 + 0xb0)) * 0.5;
      }
      amrex::MFIter::MFIter((MFIter *)local_380,&pFVar16->super_FabArrayBase,'\0');
      while ((int)avStack_370[0].
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ <
             (int)avStack_370[1].
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start._0_4_) {
        uVar9 = avStack_370[0].
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_;
        if ((Array4<double> *)
            avStack_370[2].
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (Array4<double> *)0x0) {
          uVar9 = *(int *)(*(long *)avStack_370[2].
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start +
                          (long)(int)avStack_370[0].
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ * 4);
        }
        (**(code **)(*(long *)uVar2._M_t.
                              super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                              .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0xf0))
                  (dVar27,uVar2._M_t.
                          super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                          .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,
                   (pFVar15->m_fabs_v).
                   super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[(int)uVar9],local_4d8,0,0,1);
        ppbVar13 = &avStack_370[0].
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
        if ((Array4<double> *)
            avStack_370[2].
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (Array4<double> *)0x0) {
          ppbVar13 = (pointer *)
                     ((long)(int)avStack_370[0].
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ * 4 +
                     *(long *)avStack_370[2].
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
        }
        (**(code **)(*(long *)uVar2._M_t.
                              super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                              .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0xf0))
                  (local_4d0,
                   uVar2._M_t.
                   super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
                   super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,
                   (pFVar16->m_fabs_v).
                   super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[*(int *)ppbVar13],local_4d8,0,0,1);
        amrex::MFIter::operator++((MFIter *)local_380);
      }
      amrex::MFIter::~MFIter((MFIter *)local_380);
      puVar6 = local_4a8.
               super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      this_00 = (MultiFab *)operator_new(0x180);
      local_380._0_8_ = (pointer)0x1;
      avStack_370[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      avStack_370[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_380._8_8_ = (FabArrayBase *)0x0;
      avStack_370[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      amrex::MultiFab::MultiFab
                (this_00,(BoxArray *)
                         ((long)uVar2._M_t.
                                super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0xd8
                         ),
                 (DistributionMapping *)
                 ((long)uVar2._M_t.
                        super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                        .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x140),1,1,
                 (MFInfo *)local_380,
                 *(FabFactory<amrex::FArrayBox> **)
                  ((long)uVar2._M_t.
                         super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                         .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x218));
      lVar20 = local_480;
      pMVar18 = puVar6[local_480]._M_t.
                super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
                super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
      puVar6[local_480]._M_t.
      super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
      super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
      super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl = this_00;
      if (pMVar18 != (MultiFab *)0x0) {
        (**(code **)(*(long *)&(pMVar18->super_FabArray<amrex::FArrayBox>).super_FabArrayBase + 8))
                  ();
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(avStack_370);
      local_470 = &(local_4a8.
                    super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar20]._M_t.
                    super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                    .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl)->
                   super_FabArray<amrex::FArrayBox>;
      amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                (local_470,0.0,0,(local_470->super_FabArrayBase).n_comp,
                 &(local_470->super_FabArrayBase).n_grow);
      grids = (BoxArray *)0x0;
      pNVar14 = (NavierStokesBase *)
                __dynamic_cast((__uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                )(this->parent->amr_level).
                                 super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                 .
                                 super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[lVar20]._M_t,
                               &amrex::AmrLevel::typeinfo,&NavierStokesBase::typeinfo);
      pFVar15 = &NavierStokesBase::getDivCond(pNVar14,1,local_488)->super_FabArray<amrex::FArrayBox>
      ;
      pFVar16 = &NavierStokesBase::getDivCond(pNVar14,1,(Real)local_468._32_8_)->
                 super_FabArray<amrex::FArrayBox>;
      local_478 = pFVar16;
      amrex::MFIter::MFIter((MFIter *)local_380,&local_470->super_FabArrayBase,true);
      local_468._48_8_ = pFVar15;
      if ((int)avStack_370[0].
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ <
          (int)avStack_370[1].
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start._0_4_) {
        do {
          uVar19 = local_468._48_8_;
          amrex::MFIter::growntilebox(&local_3f8,(MFIter *)local_380,-1000000);
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((Array4<double> *)local_1b8,(FabArray<amrex::FArrayBox> *)uVar19,
                     (MFIter *)local_380);
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((Array4<double> *)local_3c0,pFVar16,(MFIter *)local_380);
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (&local_1f8,local_470,(MFIter *)local_380);
          grids = (BoxArray *)(ulong)(uint)local_3f8.smallend.vect[2];
          if (local_3f8.smallend.vect[2] <= local_3f8.bigend.vect[2]) {
            lVar23 = (long)local_3f8.smallend.vect[1];
            lVar20 = (long)local_3f8.smallend.vect[0];
            local_418 = (element_type *)
                        ((lVar23 - local_1f8.begin.y) * local_1f8.jstride * 8 + lVar20 * 8 +
                         (long)local_1f8.begin.x * -8 + (long)local_1f8.p);
            local_408 = (element_type *)(local_1f8.kstride * 8);
            local_410._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)-(long)local_1f8.begin.z;
            local_468._72_8_ =
                 (lVar23 - uStack_198._4_4_) * local_1b8._8_8_ * 8 + lVar20 * 8 +
                 (long)(int)uStack_198 * -8 + local_1b8._0_8_;
            local_4d0 = (double)(local_1b8._16_8_ * 8);
            local_400._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)-(long)local_190;
            local_468._64_8_ =
                 (lVar23 - uStack_3a0._4_4_) * local_3c0._8_8_ * 8 + lVar20 * 8 +
                 (long)(int)uStack_3a0 * -8 + local_3c0._0_8_;
            local_4c0 = local_3c0._16_8_ * 8;
            local_468._56_8_ = -(long)local_398;
            do {
              iVar21 = (int)grids;
              if (local_3f8.smallend.vect[1] <= local_3f8.bigend.vect[1]) {
                lVar20 = (long)iVar21;
                lVar26 = (long)(&(local_418->bbox).smallend + -2) +
                         ((long)&(local_410._M_pi)->_vptr__Sp_counted_base + lVar20) *
                         (long)local_408;
                lVar22 = ((long)&(local_400._M_pi)->_vptr__Sp_counted_base + lVar20) *
                         (long)local_4d0 + local_468._72_8_;
                lVar24 = (lVar20 + local_468._56_8_) * local_4c0 + local_468._64_8_;
                lVar20 = lVar23;
                do {
                  if (local_3f8.smallend.vect[0] <= local_3f8.bigend.vect[0]) {
                    lVar17 = 0;
                    do {
                      *(double *)(lVar26 + lVar17 * 8) =
                           (*(double *)(lVar24 + lVar17 * 8) - *(double *)(lVar22 + lVar17 * 8)) *
                           (double)local_468._40_8_;
                      lVar17 = lVar17 + 1;
                    } while ((local_3f8.bigend.vect[0] - local_3f8.smallend.vect[0]) + 1 !=
                             (int)lVar17);
                  }
                  lVar20 = lVar20 + 1;
                  lVar26 = lVar26 + local_1f8.jstride * 8;
                  lVar22 = lVar22 + local_1b8._8_8_ * 8;
                  lVar24 = lVar24 + local_3c0._8_8_ * 8;
                } while (local_3f8.bigend.vect[1] + 1 != (int)lVar20);
              }
              grids = (BoxArray *)(ulong)(iVar21 + 1);
            } while (iVar21 != local_3f8.bigend.vect[2]);
          }
          amrex::MFIter::operator++((MFIter *)local_380);
          pFVar16 = local_478;
        } while ((int)avStack_370[0].
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ <
                 (int)avStack_370[1].
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start._0_4_);
      }
      uVar19 = local_468._48_8_;
      amrex::MFIter::~MFIter((MFIter *)local_380);
      if (pFVar16 != (FabArray<amrex::FArrayBox> *)0x0) {
        (*(((FabArray<amrex::FArrayBox> *)&pFVar16->super_FabArrayBase)->super_FabArrayBase).
          _vptr_FabArrayBase[1])(pFVar16);
      }
      lVar20 = local_480;
      pp_Var11 = local_4c8;
      if ((FabArray<amrex::FArrayBox> *)uVar19 != (FabArray<amrex::FArrayBox> *)0x0) {
        (**(code **)(*(long *)uVar19 + 8))(uVar19);
      }
      lVar20 = lVar20 + 1;
    } while (local_4ac != (int)lVar20);
  }
  pVVar5 = local_4b8;
  if (c_lev <= iVar25) {
    lVar20 = (long)c_lev;
    iVar21 = (iVar25 - c_lev) + 1;
    do {
      amrex::FabArray<amrex::FArrayBox>::setBndry<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)pp_Var11[lVar20],1e+200,0,3);
      amrex::FabArray<amrex::FArrayBox>::setBndry<amrex::FArrayBox,_0>
                (*(FabArray<amrex::FArrayBox> **)
                  (*(long *)&((this->LevelData).
                              super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                              super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar20]->state).
                             super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                             super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>
                  + 0xd0),1e+200,0,3);
      pFVar16 = &(pVVar5->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                 super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar20]->super_FabArray<amrex::FArrayBox>;
      amrex::FabArray<amrex::FArrayBox>::setBndry<amrex::FArrayBox,_0>
                (pFVar16,1e+200,0,(pFVar16->super_FabArrayBase).n_comp);
      lVar20 = lVar20 + 1;
      iVar21 = iVar21 + -1;
    } while (iVar21 != 0);
    if (c_lev <= iVar25) {
      lVar20 = (long)c_lev;
      local_4c0 = CONCAT44(local_4c0._4_4_,iVar25 + 1);
      do {
        lVar23 = *(long *)&((this->LevelData).
                            super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                            super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar20]->state).
                           super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                           super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>;
        lVar22 = *(long *)(lVar23 + 0xd0);
        fabarray_ = *(FabArrayBase **)(lVar23 + 200);
        TVar8 = amrex::StateDescriptor::timeType(*(StateDescriptor **)(lVar23 + 8));
        if (TVar8 == Point) {
          dVar27 = *(double *)(lVar23 + 0xc0);
        }
        else {
          dVar27 = (*(double *)(lVar23 + 0xb8) + *(double *)(lVar23 + 0xc0)) * 0.5;
        }
        lVar23 = *(long *)&((this->LevelData).
                            super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                            super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar20]->state).
                           super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                           super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>;
        TVar8 = amrex::StateDescriptor::timeType(*(StateDescriptor **)(lVar23 + 8));
        if (TVar8 == Point) {
          local_4d0 = *(double *)(lVar23 + 0xb0);
        }
        else {
          local_4d0 = (*(double *)(lVar23 + 0xa8) + *(double *)(lVar23 + 0xb0)) * 0.5;
        }
        amrex::MFIter::MFIter((MFIter *)local_380,fabarray_,'\0');
        while ((int)avStack_370[0].
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ <
               (int)avStack_370[1].
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start._0_4_) {
          uVar9 = avStack_370[0].
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_;
          if ((Array4<double> *)
              avStack_370[2].
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (Array4<double> *)0x0) {
            uVar9 = *(int *)(*(long *)avStack_370[2].
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start +
                            (long)(int)avStack_370[0].
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ * 4)
            ;
          }
          pAVar3 = (this->LevelData).
                   super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                   super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>._M_impl
                   .super__Vector_impl_data._M_start[lVar20];
          (*pAVar3->_vptr_AmrLevel[0x1e])
                    (dVar27,pAVar3,*(undefined8 *)(*(long *)(lVar22 + 0x108) + (long)(int)uVar9 * 8)
                     ,0,0,0,3);
          ppbVar13 = &avStack_370[0].
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
          if ((Array4<double> *)
              avStack_370[2].
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (Array4<double> *)0x0) {
            ppbVar13 = (pointer *)
                       ((long)(int)avStack_370[0].
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ * 4 +
                       *(long *)avStack_370[2].
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
          }
          pAVar3 = (this->LevelData).
                   super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                   super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>._M_impl
                   .super__Vector_impl_data._M_start[lVar20];
          grids = (BoxArray *)0x0;
          (*pAVar3->_vptr_AmrLevel[0x1e])
                    (local_4d0,pAVar3,
                     *(undefined8 *)
                      (*(long *)((long)&fabarray_[1].boxarray.m_bat.m_op + 0xc) +
                      (long)*(int *)ppbVar13 * 8),0,0,0,3);
          amrex::MFIter::operator++((MFIter *)local_380);
        }
        amrex::MFIter::~MFIter((MFIter *)local_380);
        pp_Var11 = local_4c8;
        ConvertUnew(this,(MultiFab *)local_4c8[lVar20],
                    *(MultiFab **)
                     (*(long *)&((this->LevelData).
                                 super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>
                                 .
                                 super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start[lVar20]->state).
                                super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                                super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>
                     + 0xd0),local_490,grids);
        lVar20 = lVar20 + 1;
      } while ((int)local_4c0 != (int)lVar20);
    }
  }
LAB_0036b4d9:
  bVar7 = OutFlowBC::HasOutFlowBC(this->phys_bc);
  pVVar5 = local_4b8;
  pMVar18 = (MultiFab *)CONCAT71((int7)((ulong)grids >> 8),local_4d4 == 0);
  uVar19 = extraout_RDX;
  if ((bVar7 && local_4d4 != 0) && (do_outflow_bcs != 0)) {
    amrex::GetVecOfPtrs<amrex::MultiFab>
              ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)local_380,
               (Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                *)&local_4a8);
    pMVar18 = (MultiFab *)local_468;
    set_outflow_bcs(this,0x3ec,&local_3d8,
                    (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)pMVar18,
                    (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)local_380,
                    pVVar5,c_lev,iVar25,local_4d4);
    uVar19 = extraout_RDX_00;
    if ((pointer)local_380._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_380._0_8_,
                      (long)avStack_370[0].
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start - local_380._0_8_);
      uVar19 = extraout_RDX_01;
    }
  }
  if (c_lev <= iVar25) {
    lVar20 = (long)c_lev;
    do {
      scaleVar(this,(pVVar5->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                    _M_impl.super__Vector_impl_data._M_start[lVar20],(int)uVar19,pMVar18,(int)lVar20
              );
      lVar20 = lVar20 + 1;
      uVar19 = extraout_RDX_02;
    } while (iVar25 + 1 != (int)lVar20);
  }
  if (c_lev < iVar25) {
    do {
      p_Var4 = pp_Var11[lVar10];
      local_1b8._0_8_ = (pointer)0x1;
      local_1a0 = (pointer)0x0;
      uStack_198 = (pointer)0x0;
      local_1b8._8_8_ = (Arena *)0x0;
      local_1b8._16_8_ = (pointer)0x0;
      amrex::MultiFab::MultiFab
                ((MultiFab *)local_380,(BoxArray *)(pp_Var11[lVar10 + -1] + 8),
                 (DistributionMapping *)(pp_Var11[lVar10 + -1] + 0x70),3,1,(MFInfo *)local_1b8,
                 (FabFactory<amrex::FArrayBox> *)
                 ((this->LevelData).
                  super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                  super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar10 + -1]->m_factory)._M_t.
                 super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                );
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_1b8 + 0x10));
      local_3c0._0_8_ = (double *)0x1;
      local_3a8 = (pointer)0x0;
      uStack_3a0 = (pointer)0x0;
      local_3c0._8_8_ = (Arena *)0x0;
      local_3c0._16_8_ = (pointer)0x0;
      amrex::MultiFab::MultiFab
                ((MultiFab *)local_1b8,(BoxArray *)(p_Var4 + 8),
                 (DistributionMapping *)(p_Var4 + 0x70),3,1,(MFInfo *)local_3c0,
                 (FabFactory<amrex::FArrayBox> *)
                 ((this->LevelData).
                  super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                  super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar10]->m_factory)._M_t.
                 super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                );
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_3c0 + 0x10));
      pp_Var11 = local_4c8;
      amrex::MultiFab::Copy((MultiFab *)local_380,(MultiFab *)local_4c8[lVar10 + -1],0,0,3,1);
      amrex::MultiFab::Copy((MultiFab *)local_1b8,(MultiFab *)pp_Var11[lVar10],0,0,3,1);
      pNVar14 = (NavierStokesBase *)
                __dynamic_cast((this->LevelData).
                               super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                               super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar10 + -1],
                               &amrex::AmrLevel::typeinfo,&NavierStokesBase::typeinfo);
      NavierStokesBase::average_down
                (pNVar14,(MultiFab *)local_1b8,(MultiFab *)local_380,0,local_2b4);
      amrex::MultiFab::Copy((MultiFab *)pp_Var11[lVar10 + -1],(MultiFab *)local_380,0,0,3,1);
      lVar10 = lVar10 + -1;
      amrex::MultiFab::~MultiFab((MultiFab *)local_1b8);
      amrex::MultiFab::~MultiFab((MultiFab *)local_380);
    } while (c_lev < lVar10);
  }
  pVVar5 = local_4b8;
  if ((local_4d4 != 0) && (c_lev <= iVar25)) {
    lVar10 = (long)c_lev;
    iVar21 = (iVar25 - c_lev) + 1;
    do {
      amrex::MultiFab::mult
                (local_4a8.
                 super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar10]._M_t.
                 super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
                 super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                 super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,-1.0,0,1,0);
      lVar10 = lVar10 + 1;
      iVar21 = iVar21 + -1;
    } while (iVar21 != 0);
  }
  amrex::GetVecOfPtrs<amrex::MultiFab>
            ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)local_380,
             (Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
              *)&local_4a8);
  local_1b8._0_8_ = (pointer)0x0;
  local_1b8._8_8_ = (Arena *)0x0;
  local_1b8._16_8_ = (pointer)0x0;
  pMVar18 = (MultiFab *)local_468;
  doMLMGNodalProjection
            (this,c_lev,(iVar25 - c_lev) + 1,
             (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)pMVar18,&local_3d8,
             pVVar5,(Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)local_380,
             (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)local_1b8,proj_tol,
             proj_abs_tol,true,(MultiFab *)0x0,(MultiFab *)0x0,false);
  uVar19 = extraout_RDX_03;
  if ((pointer)local_380._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_380._0_8_,
                    (long)avStack_370[0].
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start - local_380._0_8_);
    uVar19 = extraout_RDX_04;
  }
  if (c_lev <= iVar25) {
    lVar10 = (long)c_lev;
    do {
      rescaleVar(this,(pVVar5->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                      _M_impl.super__Vector_impl_data._M_start[lVar10],(int)uVar19,pMVar18,
                 (int)lVar10);
      lVar10 = lVar10 + 1;
      uVar19 = extraout_RDX_05;
    } while (iVar25 + 1 != (int)lVar10);
    if (c_lev <= iVar25) {
      lVar10 = (long)c_lev;
      iVar25 = (iVar25 - c_lev) + 1;
      do {
        amrex::MultiFab::Add
                  (*(MultiFab **)
                    (*(long *)&((this->LevelData).
                                super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                                super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar10]->state).
                               super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                               super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>
                    + 0x1a8),ppMVar12[lVar10],0,0,1,1);
        lVar10 = lVar10 + 1;
        iVar25 = iVar25 + -1;
      } while (iVar25 != 0);
    }
  }
  pp_Var11 = local_4c8;
  if (verbose != 0) {
    dVar27 = amrex::ParallelDescriptor::second();
    local_380._8_8_ = amrex::OutStream();
    local_380._4_4_ = *(undefined4 *)(DAT_00816950 + -0x48);
    local_380._0_4_ = *(undefined4 *)(DAT_00816950 + -0x30);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)avStack_370);
    *(undefined8 *)
     ((long)&avStack_370[0].
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish +
     *(size_type *)
      ((long)avStack_370[0].
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start - 0x18)) =
         *(undefined8 *)
          ((ostream *)(local_380._8_8_ + 8) + *(long *)(*(long *)local_380._8_8_ + -0x18));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)avStack_370,"Projection::initialSyncProject(): time: ",0x28);
    std::ostream::_M_insert<double>(dVar27 - (double)local_468._24_8_);
    local_1b8[0] = 10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)avStack_370,local_1b8,1);
    amrex::Print::~Print((Print *)local_380);
  }
  std::
  vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ::~vector(&local_4a8);
  operator_delete(ppMVar12,0x50);
  operator_delete(pp_Var11,0x50);
  return;
}

Assistant:

void
Projection::initialSyncProject (int       c_lev,
                                const Vector<MultiFab*> sig,
                                Real      dt,
                                Real      strt_time,
                                int       have_divu)
{
    int lev;
    int f_lev = parent->finestLevel();

    if (verbose)
      amrex::Print() << "Projection::initialSyncProject(): levels = " << c_lev << " - " << f_lev << '\n';

    if (verbose && benchmarking) ParallelDescriptor::Barrier();

    const Real stime = ParallelDescriptor::second();

    //
    // Gather data.
    //
    Vector<MultiFab*> vel(maxlev, nullptr);
    Vector<MultiFab*> phi(maxlev, nullptr);

    for (lev = c_lev; lev <= f_lev; lev++)
    {
        vel[lev] = &(LevelData[lev]->get_new_data(State_Type));
        // phi points to P_old and we use it as a temporary to
        // store phi resulting from the nodal projection, AKA
        // the pressure increment
        phi[lev] = &(LevelData[lev]->get_old_data(Press_Type));
        phi[lev] -> setVal(0.0);
    }

    const Real dt_inv = 1./dt;

    //
    // Source term
    //
    Vector<std::unique_ptr<MultiFab> > rhcc;
    if (have_divu)
    {
        rhcc.resize(maxlev);

        //
        // Set up rhcc for manual project.
        //
        for (lev = c_lev; lev <= f_lev; lev++)
        {
            AmrLevel& amr_level = parent->getLevel(lev);

            int Divu_Type, Divu;
            if (!LevelData[c_lev]->isStateVariable("divu", Divu_Type, Divu))
                amrex::Error("Projection::initialSyncProject(): Divu not found");
            //
            // Make sure ghost cells are properly filled.
            //
            MultiFab& divu_new = amr_level.get_new_data(Divu_Type);
            MultiFab& divu_old = amr_level.get_old_data(Divu_Type);
            divu_new.FillBoundary();
            divu_old.FillBoundary();

            Real prev_time = amr_level.get_state_data(Divu_Type).prevTime();
            Real curr_time = amr_level.get_state_data(Divu_Type).curTime();

            for (MFIter mfi(divu_new); mfi.isValid(); ++mfi)
            {
                amr_level.setPhysBoundaryValues(divu_old[mfi],Divu_Type,prev_time,0,0,1);
                amr_level.setPhysBoundaryValues(divu_new[mfi],Divu_Type,curr_time,0,0,1);
            }

	    // Needed for set_outflow_bcs(). MLMG ignores rh ghost cells.
            const int nghost = 1;
            rhcc[lev].reset(new MultiFab(amr_level.boxArray(),
                            amr_level.DistributionMap(),
                            1,nghost,MFInfo(),amr_level.Factory()));
            MultiFab* rhcclev = rhcc[lev].get();
            rhcclev->setVal(0);

            NavierStokesBase* ns = dynamic_cast<NavierStokesBase*>(&parent->getLevel(lev));

            AMREX_ASSERT(!(ns == 0));

            std::unique_ptr<MultiFab> divu (ns->getDivCond(nghost,strt_time));
            std::unique_ptr<MultiFab> dsdt (ns->getDivCond(nghost,strt_time+dt));

#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (MFIter mfi(*rhcclev,TilingIfNotGPU()); mfi.isValid(); ++mfi)
            {
               const Box& bx = mfi.growntilebox();
               const auto& du       = divu->array(mfi);
               const auto& dsdt_arr = dsdt->array(mfi);
               const auto& rhcc_arr = rhcclev->array(mfi);
               amrex::ParallelFor(bx, [du,dsdt_arr,rhcc_arr,dt_inv]
               AMREX_GPU_DEVICE (int i, int j, int k) noexcept
               {
                  rhcc_arr(i,j,k) = ( dsdt_arr(i,j,k) - du(i,j,k) ) * dt_inv;
               });
            }
        }
    }

    //
    // Set velocity bndry values to bogus values.
    //
    for (lev = c_lev; lev <= f_lev; lev++)
    {
        vel[lev]->setBndry(BogusValue,Xvel,AMREX_SPACEDIM);
        MultiFab &u_o = LevelData[lev]->get_old_data(State_Type);
        u_o.setBndry(BogusValue,Xvel,AMREX_SPACEDIM);
        sig[lev]->setBndry(BogusValue);
    }

    //
    // Convert velocities to accelerations (we always do this for the
    //  projections in these initial iterations).
    //
    for (lev = c_lev; lev <= f_lev; lev++)
    {
        MultiFab& S_old = LevelData[lev]->get_old_data(State_Type);
        MultiFab& S_new = LevelData[lev]->get_new_data(State_Type);

        Real prev_time = LevelData[lev]->get_state_data(State_Type).prevTime();
        Real curr_time = LevelData[lev]->get_state_data(State_Type).curTime();

        for (MFIter mfi(S_new); mfi.isValid(); ++mfi)
        {
            LevelData[lev]->setPhysBoundaryValues(S_old[mfi],State_Type,prev_time,Xvel,Xvel,AMREX_SPACEDIM);
            LevelData[lev]->setPhysBoundaryValues(S_new[mfi],State_Type,curr_time,Xvel,Xvel,AMREX_SPACEDIM);
        }

        MultiFab& u_o = LevelData[lev]->get_old_data(State_Type);
        ConvertUnew(*vel[lev], u_o, dt, LevelData[lev]->boxArray());
    }

    if (OutFlowBC::HasOutFlowBC(phys_bc) && have_divu && do_outflow_bcs) {
        set_outflow_bcs(INITIAL_SYNC,phi,vel,
                        amrex::GetVecOfPtrs(rhcc),
                        sig,c_lev,f_lev,have_divu);
    }

    //
    // Scale initial sync projection variables.
    //
    for (lev = c_lev; lev <= f_lev; lev++)
    {
        scaleVar(sig[lev],1,vel[lev],lev);

        if (have_divu && parent->Geom(0).IsRZ())
          radMultScal(lev,*(rhcc[lev]));
    }

    for (lev = f_lev; lev >= c_lev+1; lev--) {
      const BoxArray& crse_grids = vel[lev-1]->boxArray();
      const BoxArray& fine_grids = vel[lev  ]->boxArray();
      const DistributionMapping& crse_dmap = vel[lev-1]->DistributionMap();
      const DistributionMapping& fine_dmap = vel[lev  ]->DistributionMap();

      MultiFab v_crse(crse_grids, crse_dmap, AMREX_SPACEDIM, 1, MFInfo(), LevelData[lev-1]->Factory());
      MultiFab v_fine(fine_grids, fine_dmap, AMREX_SPACEDIM, 1, MFInfo(), LevelData[lev]->Factory());

      MultiFab::Copy(v_crse, *vel[lev-1], 0, 0, AMREX_SPACEDIM, 1);
      MultiFab::Copy(v_fine, *vel[lev  ], 0, 0, AMREX_SPACEDIM, 1);

      NavierStokesBase* ns = dynamic_cast<NavierStokesBase*>(LevelData[lev-1]);
      ns->average_down(v_fine, v_crse, 0, v_crse.nComp());

      MultiFab::Copy(*vel[lev-1], v_crse, 0, 0, AMREX_SPACEDIM, 1);
    }

    //
    // Project.
    //
    if (have_divu) {
        for (lev = c_lev; lev <= f_lev; lev++)
        {
            rhcc[lev]->mult(-1.0,0,1);
        }
    }

    bool increment_gp = true;
    doMLMGNodalProjection(c_lev, f_lev-c_lev+1, vel, phi, sig,
                          amrex::GetVecOfPtrs(rhcc),
                          {}, proj_tol, proj_abs_tol, increment_gp, 0, 0);

    //
    // Unscale initial sync projection variables.
    //
    for (lev = c_lev; lev <= f_lev; lev++)
        rescaleVar(sig[lev],1,vel[lev],lev);

    //
    // Add correction at coarse and fine levels.
    // Only update new. NSB::resetState will take care of setting
    // old = new
    //
    for (lev = c_lev; lev <= f_lev; lev++)
    {
        MultiFab& P_new = LevelData[lev]->get_new_data(Press_Type);
        MultiFab::Add(P_new, *phi[lev], 0, 0, 1, 1);
    }

    //
    // Grad(P_new) incremented in doMLMGNodalProjection.
    //

    if (verbose)
    {
        const int IOProc   = ParallelDescriptor::IOProcessorNumber();
        Real      run_time = ParallelDescriptor::second() - stime;

        ParallelDescriptor::ReduceRealMax(run_time,IOProc);

        amrex::Print() << "Projection::initialSyncProject(): time: " << run_time << '\n';
    }
}